

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vm.hpp
# Opt level: O0

void __thiscall squall::VM::~VM(VM *this)

{
  HSQUIRRELVM v;
  VM *this_local;
  
  v = handle(this);
  sq_setforeignptr(v,(SQUserPointer)0x0);
  std::unique_ptr<squall::TableBase,_std::default_delete<squall::TableBase>_>::~unique_ptr
            (&this->root_table_);
  KlassTable::~KlassTable(&this->klass_table_);
  detail::VMImp::~VMImp(&this->imp_);
  return;
}

Assistant:

~VM() { sq_setforeignptr(handle(), 0); }